

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void dataOfferHandleOffer(void *userData,wl_data_offer *offer,char *mimeType)

{
  int iVar1;
  uint local_24;
  uint i;
  char *mimeType_local;
  wl_data_offer *offer_local;
  void *userData_local;
  
  local_24 = 0;
  while( true ) {
    if (_glfw.wl.offerCount <= local_24) {
      return;
    }
    if (_glfw.wl.offers[local_24].offer == offer) break;
    local_24 = local_24 + 1;
  }
  iVar1 = strcmp(mimeType,"text/plain;charset=utf-8");
  if (iVar1 == 0) {
    _glfw.wl.offers[local_24].text_plain_utf8 = 1;
    return;
  }
  iVar1 = strcmp(mimeType,"text/uri-list");
  if (iVar1 != 0) {
    return;
  }
  _glfw.wl.offers[local_24].text_uri_list = 1;
  return;
}

Assistant:

static void dataOfferHandleOffer(void* userData,
                                 struct wl_data_offer* offer,
                                 const char* mimeType)
{
    for (unsigned int i = 0; i < _glfw.wl.offerCount; i++)
    {
        if (_glfw.wl.offers[i].offer == offer)
        {
            if (strcmp(mimeType, "text/plain;charset=utf-8") == 0)
                _glfw.wl.offers[i].text_plain_utf8 = GLFW_TRUE;
            else if (strcmp(mimeType, "text/uri-list") == 0)
                _glfw.wl.offers[i].text_uri_list = GLFW_TRUE;

            break;
        }
    }
}